

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  size_t sVar2;
  FilePath *in_RDI;
  char *__s;
  char cwd [4097];
  string local_1048;
  char local_1028 [4104];
  
  memset(local_1028,0,0x1001);
  pcVar1 = getcwd(local_1028,0x1001);
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = local_1028;
  }
  local_1048._M_dataplus._M_p = (pointer)&local_1048.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1048,__s,__s + sVar2);
  FilePath(in_RDI,&local_1048);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
    operator_delete(local_1048._M_dataplus._M_p,local_1048.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE || GTEST_OS_WINDOWS_RT
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == NULL ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}